

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  undefined1 uVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *in_RSI;
  SQObjectPtr *in_RDI;
  SQObjectPtr attrs;
  SQObjectPtr *val;
  SQObjectPtr *key;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SQObjectPtr **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  SQInteger in_stack_ffffffffffffffd0;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQClass *in_stack_fffffffffffffff8;
  SQVM *pSVar4;
  
  bVar1 = sq_aux_gettypedarg(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  if (bVar1) {
    pSVar3 = stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
    stack_get(in_stack_ffffffffffffffa0,(SQInteger)in_stack_ffffffffffffff98);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffc0);
    if ((pSVar3->super_SQObject)._type == OT_NULL) {
      SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      SQObjectPtr::operator=
                ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (SQObjectPtr *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      SQVM::Pop((SQVM *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      SQVM::Push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      pSVar4 = (SQVM *)0x0;
    }
    else {
      uVar2 = SQClass::GetAttributes(in_stack_fffffffffffffff8,in_RDI,in_RSI);
      if ((bool)uVar2) {
        SQClass::SetAttributes(in_stack_fffffffffffffff8,in_RDI,in_RSI);
        SQVM::Pop((SQVM *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  CONCAT17(uVar2,in_stack_ffffffffffffffa8));
        SQVM::Push(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        pSVar4 = (SQVM *)0x0;
      }
      else {
        in_stack_ffffffffffffffa0 =
             (SQVM *)sq_throwerror(in_stack_ffffffffffffffa0,(SQChar *)in_stack_ffffffffffffff98);
        pSVar4 = in_stack_ffffffffffffffa0;
      }
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
  }
  else {
    pSVar4 = (SQVM *)0xffffffffffffffff;
  }
  return (SQRESULT)pSVar4;
}

Assistant:

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-2);
    SQObjectPtr &val = stack_get(v,-1);
    SQObjectPtr attrs;
    if(sq_type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        _class(*o)->_attributes = val;
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }else if(_class(*o)->GetAttributes(key,attrs)) {
        _class(*o)->SetAttributes(key,val);
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}